

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::PreLoadCMakeFiles(cmake *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_55 [13];
  string local_48 [8];
  string pre_load;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmake *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&pre_load.field_2 + 8));
  pcVar2 = GetHomeDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar2,local_55);
  std::allocator<char>::~allocator((allocator<char> *)local_55);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=(local_48,"/PreLoad.cmake");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      ReadListFile(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&pre_load.field_2 + 8),pcVar2);
    }
  }
  pcVar2 = GetHomeOutputDirectory(this);
  std::__cxx11::string::operator=(local_48,pcVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=(local_48,"/PreLoad.cmake");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      ReadListFile(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&pre_load.field_2 + 8),pcVar2);
    }
  }
  std::__cxx11::string::~string(local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&pre_load.field_2 + 8));
  return;
}

Assistant:

void cmake::PreLoadCMakeFiles()
{
  std::vector<std::string> args;
  std::string pre_load = this->GetHomeDirectory();
  if (!pre_load.empty()) {
    pre_load += "/PreLoad.cmake";
    if (cmSystemTools::FileExists(pre_load.c_str())) {
      this->ReadListFile(args, pre_load.c_str());
    }
  }
  pre_load = this->GetHomeOutputDirectory();
  if (!pre_load.empty()) {
    pre_load += "/PreLoad.cmake";
    if (cmSystemTools::FileExists(pre_load.c_str())) {
      this->ReadListFile(args, pre_load.c_str());
    }
  }
}